

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O2

string * __thiscall
bssl::(anonymous_namespace)::CertErrorParams2SizeT::ToDebugString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *__lhs;
  int i;
  int i_00;
  allocator<char> local_142;
  allocator<char> local_141;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __lhs = *(char **)((long)this + 8);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,": ",&local_141);
  ::std::operator+(&local_e0,__lhs,&local_40);
  string_util::NumberToDecimalString_abi_cxx11_
            (&local_100,(string_util *)(ulong)*(uint *)((long)this + 0x10),i);
  ::std::operator+(&local_c0,&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100);
  ::std::operator+(&local_a0,&local_c0,"\n");
  ::std::operator+(&local_80,&local_a0,*(char **)((long)this + 0x18));
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,": ",&local_142);
  ::std::operator+(&local_60,&local_80,&local_120);
  string_util::NumberToDecimalString_abi_cxx11_
            (&local_140,(string_util *)(ulong)*(uint *)((long)this + 0x20),i_00);
  ::std::operator+(__return_storage_ptr__,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140);
  ::std::__cxx11::string::~string((string *)&local_140);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_120);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_100);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ToDebugString() const override {
    return name1_ + std::string(": ") +
           bssl::string_util::NumberToDecimalString(value1_) + "\n" + name2_ +
           std::string(": ") +
           bssl::string_util::NumberToDecimalString(value2_);
  }